

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::set_name(FileDescriptorProto *this,char *value)

{
  LogMessage *other;
  LogFinisher local_51;
  undefined1 local_50 [56];
  
  if (value == (char *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x103a);
    other = internal::LogMessage::operator<<((LogMessage *)local_50,"CHECK failed: value != NULL: ")
    ;
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_50);
  }
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
  std::__cxx11::string::string((string *)local_50,value,(allocator *)&local_51);
  internal::ArenaStringPtr::SetNoArena
            (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_50);
  if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  return;
}

Assistant:

inline void FileDescriptorProto::set_name(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  set_has_name();
  name_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), ::std::string(value));
  // @@protoc_insertion_point(field_set_char:google.protobuf.FileDescriptorProto.name)
}